

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRange(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *newLhs,
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *newRhs,bool scale)

{
  ulong uVar1;
  undefined8 *puVar2;
  pointer pnVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  ulong uVar10;
  long lVar11;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined1 local_fc;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 uStack_43;
  undefined8 local_38;
  
  pcVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
  uVar5 = *(undefined8 *)((pcVar9->data)._M_elems + 2);
  uVar6 = *(undefined8 *)((pcVar9->data)._M_elems + 4);
  uVar7 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
  *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems =
       *(undefined8 *)(pcVar9->data)._M_elems;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) = uVar5;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) = uVar6;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) = uVar7;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) =
       *(undefined8 *)((pcVar9->data)._M_elems + 8);
  (this->m_nonbasicValue).m_backend.exp = pcVar9->exp;
  (this->m_nonbasicValue).m_backend.neg = pcVar9->neg;
  iVar8 = pcVar9->prec_elem;
  (this->m_nonbasicValue).m_backend.fpclass = pcVar9->fpclass;
  (this->m_nonbasicValue).m_backend.prec_elem = iVar8;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::changeLhs(&this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,newLhs,scale);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::changeRhs(&this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,newRhs,scale);
  if (NO_PROBLEM <
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus) {
    uVar10 = (ulong)(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
    if (0 < (long)uVar10) {
      lVar11 = uVar10 * 0x38 + -8;
      do {
        uVar1 = uVar10 - 1;
        pnVar3 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_c8 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -0x10);
        puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -0x30);
        local_e8 = *puVar2;
        uStack_e0 = puVar2[1];
        puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -0x20);
        local_d8 = *puVar2;
        uStack_d0 = puVar2[1];
        local_c0 = *(undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -8);
        local_bc = *(undefined1 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -4);
        local_b8 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar11);
        local_38 = 0xa00000000;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_4b = 0;
        uStack_48 = 0;
        uStack_43 = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x6b])
                  (this,uVar1 & 0xffffffff,&local_e8,(cpp_dec_float<50u,int,void> *)&local_68);
        pnVar3 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_108 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -0x10);
        puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -0x30);
        local_128 = *puVar2;
        uStack_120 = puVar2[1];
        puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -0x20);
        local_118 = *puVar2;
        uStack_110 = puVar2[1];
        local_100 = *(undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -8);
        local_fc = *(undefined1 *)((long)(pnVar3->m_backend).data._M_elems + lVar11 + -4);
        local_f8 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar11);
        local_78 = 0xa00000000;
        local_a8 = 0;
        uStack_a0 = 0;
        local_98 = 0;
        uStack_90 = 0;
        uStack_8b = 0;
        uStack_88 = 0;
        uStack_83 = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x6c])
                  (this,uVar1 & 0xffffffff,&local_128,(cpp_dec_float<50u,int,void> *)&local_a8);
        lVar11 = lVar11 + -0x38;
        bVar4 = 1 < (long)uVar10;
        uVar10 = uVar1;
      } while (bVar4);
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x77])(this);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRange(const VectorBase<R>& newLhs, const VectorBase<R>& newRhs,
                                   bool scale)
{
   // we better recompute the nonbasic value when changing all ranges
   forceRecompNonbasicValue();

   SPxLPBase<R>::changeLhs(newLhs, scale);
   SPxLPBase<R>::changeRhs(newRhs, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      for(int i = this->nRows() - 1; i >= 0; --i)
      {
         changeLhsStatus(i, this->lhs(i));
         changeRhsStatus(i, this->rhs(i));
      }

      unInit();
   }
}